

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O1

bool __thiscall
prometheus::BasicAuthHandler::AuthorizeInner
          (BasicAuthHandler *this,CivetServer *param_1,mg_connection *conn)

{
  bool bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> username;
  string decoded;
  string prefix;
  string authHeaderStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> password;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b64Auth;
  string local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  string *local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __s = mg_get_header(conn,"Authorization");
  if (__s == (char *)0x0) {
    bVar1 = false;
  }
  else {
    local_90[0] = local_80;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,__s,__s + sVar3);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Basic ","");
    iVar2 = std::__cxx11::string::compare((ulong)local_90,0,local_a8);
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)local_90);
      local_c8 = 0;
      local_c0[0] = 0;
      local_d0 = local_c0;
      detail::base64_decode(&local_f0,&local_50);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      bVar1 = false;
      lVar4 = std::__cxx11::string::find((char)&local_d0,0x3a);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_d0);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_d0);
        if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
          uVar5 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          _Unwind_Resume(uVar5);
        }
        bVar1 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_f0,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    else {
      bVar1 = false;
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  return bVar1;
}

Assistant:

bool BasicAuthHandler::AuthorizeInner(CivetServer*, mg_connection* conn) {
  const char* authHeader = mg_get_header(conn, "Authorization");

  if (authHeader == nullptr) {
    // No auth header was provided.
    return false;
  }
  std::string authHeaderStr = authHeader;

  // Basic auth header is expected to be of the form:
  // "Basic dXNlcm5hbWU6cGFzc3dvcmQ="

  const std::string prefix = "Basic ";
  if (authHeaderStr.compare(0, prefix.size(), prefix) != 0) {
    return false;
  }

  // Strip the "Basic " prefix leaving the base64 encoded auth string
  auto b64Auth = authHeaderStr.substr(prefix.size());

  std::string decoded;
  try {
    decoded = detail::base64_decode(b64Auth);
  } catch (...) {
    return false;
  }

  // decoded auth string is expected to be of the form:
  // "username:password"
  // colons may not appear in the username.
  auto splitPos = decoded.find(':');
  if (splitPos == std::string::npos) {
    return false;
  }

  auto username = decoded.substr(0, splitPos);
  auto password = decoded.substr(splitPos + 1);

  // TODO: bool does not permit a distinction between 401 Unauthorized
  //  and 403 Forbidden. Authentication may succeed, but the user still
  //  not be authorized to perform the request.
  return callback_(username, password);
}